

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O3

ssize_t __thiscall
Json::StyledWriter::write_abi_cxx11_(StyledWriter *this,int __fd,void *__buf,size_t __n)

{
  pointer pcVar1;
  undefined4 in_register_00000034;
  StyledWriter *this_00;
  
  this_00 = (StyledWriter *)CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::_M_replace
            ((ulong)&this_00->document_,0,(char *)(this_00->document_)._M_string_length,0x1193cc);
  this_00->addChildValues_ = false;
  std::__cxx11::string::_M_replace
            ((ulong)&this_00->indentString_,0,(char *)(this_00->indentString_)._M_string_length,
             0x1193cc);
  writeCommentBeforeValue(this_00,(Value *)__buf);
  writeValue(this_00,(Value *)__buf);
  writeCommentAfterValueOnSameLine(this_00,(Value *)__buf);
  std::__cxx11::string::append((char *)&this_00->document_);
  (this->super_Writer)._vptr_Writer =
       (_func_int **)
       &(this->childValues_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish;
  pcVar1 = (this_00->document_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (this_00->document_)._M_string_length);
  return (ssize_t)this;
}

Assistant:

JSONCPP_STRING StyledWriter::write(const Value& root) {
  document_ = "";
  addChildValues_ = false;
  indentString_ = "";
  writeCommentBeforeValue(root);
  writeValue(root);
  writeCommentAfterValueOnSameLine(root);
  document_ += "\n";
  return document_;
}